

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O3

void CreateBackwardReferencesNH35
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals,BackwardReferenceFromDecoder *backward_references,
               size_t *back_refs_position,size_t back_refs_size)

{
  uint8_t *puVar1;
  byte bVar2;
  uint32_t uVar3;
  long lVar4;
  ushort uVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ulong *puVar11;
  int iVar12;
  int iVar13;
  bool bVar14;
  bool bVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ushort uVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  uint8_t uVar23;
  int iVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  uint8_t *puVar30;
  ulong uVar31;
  uint32_t uVar32;
  ulong uVar33;
  ulong local_138;
  ulong local_130;
  ulong local_128;
  ulong local_108;
  ulong local_100;
  ulong local_f0;
  ulong local_e8;
  size_t *local_e0;
  int local_ac;
  ulong local_a8 [4];
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  long local_68;
  ulong local_60;
  ulong local_58;
  long local_50;
  long local_48;
  ulong local_40;
  ulong local_38;
  
  local_70 = (position - 7) + num_bytes;
  local_40 = position;
  if (7 < num_bytes) {
    local_40 = local_70;
  }
  local_68 = 0x200;
  if (*(int *)(literal_context_lut + 4) < 9) {
    local_68 = 0x40;
  }
  local_100 = *(ulong *)dist_cache;
  local_a8[3] = position + num_bytes;
  uVar31 = local_a8[3];
  if (local_a8[3] <= position + 8) {
    local_e0 = last_insert_len;
LAB_0010efe0:
    *(ulong *)dist_cache = (local_100 + uVar31) - position;
    *(long *)commands = *(long *)commands + ((long)local_e0 - (long)last_insert_len >> 4);
    return;
  }
  uVar16 = (1L << (literal_context_lut[8] & 0x3f)) - 0x10;
  local_48 = *(long *)(literal_context_lut + 0x10);
  local_88 = local_68 + position;
  lVar4 = *(long *)&(params->hasher).num_last_distances_to_check;
  local_60 = ringbuffer_mask & 0xffffffff;
  local_58 = (ulong)(uint)((int)local_68 * 4);
  local_50 = (position - 1) + num_bytes;
  local_e0 = last_insert_len;
  uVar25 = position;
LAB_0010e169:
  uVar26 = uVar31 - uVar25;
  uVar33 = uVar16;
  if (uVar25 < uVar16) {
    uVar33 = uVar25;
  }
  uVar29 = uVar25 & ringbuffer_mask;
  puVar1 = ringbuffer + uVar29;
  uVar23 = ringbuffer[uVar29];
  local_f0 = (ulong)*(int *)&(hasher->common).extra;
  local_e8 = 0x7e4;
  local_60._0_4_ = (uint)ringbuffer_mask;
  if (uVar25 - local_f0 < uVar25) {
    uVar10 = (ulong)((uint)(uVar25 - local_f0) & (uint)local_60);
    if (uVar23 == ringbuffer[uVar10]) {
      if (7 < uVar26) {
        local_128 = uVar26 & 0xfffffffffffffff8;
        puVar30 = ringbuffer + local_128 + uVar29;
        lVar20 = 0;
        uVar17 = 0;
LAB_0010e1ed:
        if (*(ulong *)(puVar1 + uVar17 * 8) == *(ulong *)(ringbuffer + uVar17 * 8 + uVar10))
        goto code_r0x0010e1fa;
        uVar17 = *(ulong *)(ringbuffer + uVar17 * 8 + uVar10) ^ *(ulong *)(puVar1 + uVar17 * 8);
        uVar10 = 0;
        if (uVar17 != 0) {
          for (; (uVar17 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
          }
        }
        uVar17 = (uVar10 >> 3 & 0x1fffffff) - lVar20;
        goto LAB_0010e24f;
      }
      local_128 = 0;
      puVar30 = puVar1;
LAB_0010ef9a:
      uVar22 = uVar26 & 7;
      uVar17 = local_128;
      if (uVar22 != 0) {
        uVar28 = local_128 | uVar22;
        do {
          uVar17 = local_128;
          if (ringbuffer[local_128 + uVar10] != *puVar30) break;
          puVar30 = puVar30 + 1;
          local_128 = local_128 + 1;
          uVar22 = uVar22 - 1;
          uVar17 = uVar28;
        } while (uVar22 != 0);
      }
LAB_0010e24f:
      if ((3 < uVar17) && (uVar10 = uVar17 * 0x87 + 0x78f, 0x7e4 < uVar10)) {
        uVar23 = puVar1[uVar17];
        local_128 = uVar17;
        local_e8 = uVar10;
        goto LAB_0010e29d;
      }
    }
    local_f0 = 0;
    local_128 = 0;
  }
  else {
    local_f0 = 0;
    local_128 = 0;
  }
LAB_0010e29d:
  local_a8[0] = (ulong)(*(long *)(ringbuffer + uVar29) * -0x42e1ca5843000000) >> 0x30;
  local_a8[1] = (ulong)((ushort)((ulong)(*(long *)(ringbuffer + uVar29) * -0x42e1ca5843000000) >>
                                0x30) + 8 & 0xffff);
  uVar8 = (uint)uVar25;
  uVar10 = (ulong)((uint)uVar26 & 7);
  uVar17 = uVar26 & 0xfffffffffffffff8;
  puVar11 = local_a8;
  bVar15 = true;
  do {
    bVar14 = bVar15;
    uVar9 = *(uint *)(lVar4 + *puVar11 * 4);
    uVar7 = (uint)local_60 & uVar9;
    if (((uVar23 == ringbuffer[local_128 + uVar7]) && (uVar25 != uVar9)) &&
       (uVar22 = uVar25 - uVar9, uVar22 <= uVar33)) {
      if (7 < uVar26) {
        lVar20 = 0;
        uVar28 = 0;
LAB_0010e351:
        if (*(ulong *)(puVar1 + uVar28 * 8) == *(ulong *)(ringbuffer + uVar28 * 8 + (ulong)uVar7))
        goto code_r0x0010e35e;
        uVar21 = *(ulong *)(ringbuffer + uVar28 * 8 + (ulong)uVar7) ^
                 *(ulong *)(puVar1 + uVar28 * 8);
        uVar28 = 0;
        if (uVar21 != 0) {
          for (; (uVar21 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
          }
        }
        uVar28 = (uVar28 >> 3 & 0x1fffffff) - lVar20;
        goto LAB_0010e398;
      }
      uVar21 = 0;
      puVar30 = puVar1;
LAB_0010e3ed:
      uVar28 = uVar21;
      if (uVar10 != 0) {
        uVar27 = uVar10 | uVar21;
        uVar18 = uVar10;
        do {
          uVar28 = uVar21;
          if (ringbuffer[uVar21 + uVar7] != *puVar30) break;
          puVar30 = puVar30 + 1;
          uVar21 = uVar21 + 1;
          uVar18 = uVar18 - 1;
          uVar28 = uVar27;
        } while (uVar18 != 0);
      }
LAB_0010e398:
      if (3 < uVar28) {
        iVar13 = 0x1f;
        if ((uint)uVar22 != 0) {
          for (; (uint)uVar22 >> iVar13 == 0; iVar13 = iVar13 + -1) {
          }
        }
        uVar21 = (ulong)(iVar13 * -0x1e + 0x780) + uVar28 * 0x87;
        if (local_e8 < uVar21) {
          uVar23 = puVar1[uVar28];
          local_128 = uVar28;
          local_f0 = uVar22;
          local_e8 = uVar21;
        }
      }
    }
    puVar11 = local_a8 + 1;
    bVar15 = false;
  } while (bVar14);
  *(uint *)(lVar4 + *(long *)((long)local_a8 + (ulong)(uVar8 & 8)) * 4) = uVar8;
  if (0x1f < uVar26 && (uVar25 & 3) == 0) {
    uVar29 = (params->dist).max_distance;
    if (uVar29 <= uVar25) {
      uVar32 = (params->dist).distance_postfix_bits;
      iVar13 = *(int *)((long)&(params->dictionary).words + 4);
      uVar3 = (params->dictionary).num_transforms;
LAB_0010e48b:
      uVar9 = uVar32 & 0x3fffffff;
      bVar6 = ringbuffer[uVar29 & ringbuffer_mask];
      bVar2 = ringbuffer[uVar29 + 0x20 & ringbuffer_mask];
      if (uVar9 < 0x1000000) {
        lVar20 = *(long *)&(params->dist).alphabet_size_max;
        uVar7 = *(uint *)(lVar20 + (ulong)uVar9 * 4);
        *(int *)(lVar20 + (ulong)uVar9 * 4) = (int)uVar29;
        if ((uVar29 == uVar25) && (uVar7 != 0xffffffff)) {
          uVar9 = uVar8 - uVar7;
          if (uVar9 <= uVar33) {
            lVar20 = 0;
            uVar31 = 0;
LAB_0010e51c:
            if (*(ulong *)(puVar1 + uVar31 * 8) ==
                *(ulong *)(ringbuffer + uVar31 * 8 + (ulong)(uVar7 & (uint)local_60)))
            goto code_r0x0010e529;
            uVar22 = *(ulong *)(ringbuffer + uVar31 * 8 + (ulong)(uVar7 & (uint)local_60)) ^
                     *(ulong *)(puVar1 + uVar31 * 8);
            uVar31 = 0;
            if (uVar22 != 0) {
              for (; (uVar22 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
              }
            }
            uVar22 = (uVar31 >> 3 & 0x1fffffff) - lVar20;
            goto LAB_0010e573;
          }
        }
      }
      goto LAB_0010e4df;
    }
    goto LAB_0010e5e4;
  }
  goto LAB_0010e5f6;
code_r0x0010e1fa:
  uVar17 = uVar17 + 1;
  lVar20 = lVar20 + -8;
  if (uVar26 >> 3 == uVar17) goto LAB_0010ef9a;
  goto LAB_0010e1ed;
code_r0x0010e35e:
  uVar28 = uVar28 + 1;
  lVar20 = lVar20 + -8;
  uVar21 = uVar17;
  puVar30 = ringbuffer + uVar17 + uVar29;
  if (uVar26 >> 3 == uVar28) goto LAB_0010e3ed;
  goto LAB_0010e351;
code_r0x0010e529:
  uVar31 = uVar31 + 1;
  lVar20 = lVar20 + -8;
  uVar22 = uVar17;
  uVar28 = uVar17;
  uVar21 = uVar10;
  if (uVar26 >> 3 == uVar31) goto joined_r0x0010e542;
  goto LAB_0010e51c;
joined_r0x0010e542:
  for (; (uVar21 != 0 &&
         (uVar22 = uVar28, ringbuffer[uVar28 + (uVar7 & (uint)local_60)] == puVar1[uVar28]));
      uVar28 = uVar28 + 1) {
    uVar22 = uVar26;
    uVar21 = uVar21 - 1;
  }
LAB_0010e573:
  uVar31 = local_a8[3];
  if ((3 < uVar22) && (uVar31 = local_a8[3], local_128 < uVar22)) {
    iVar12 = 0x1f;
    if (uVar9 != 0) {
      for (; uVar9 >> iVar12 == 0; iVar12 = iVar12 + -1) {
      }
    }
    uVar28 = (ulong)(iVar12 * -0x1e + 0x780) + uVar22 * 0x87;
    if (local_e8 < uVar28) {
      local_128 = uVar22;
      local_f0 = (ulong)uVar9;
      local_e8 = uVar28;
    }
  }
LAB_0010e4df:
  uVar32 = ~(uint)bVar6 * uVar3 + (uint)bVar2 + uVar32 * iVar13 + 1;
  uVar29 = uVar29 + 4;
  if (uVar25 < uVar29) goto LAB_0010e5cd;
  goto LAB_0010e48b;
LAB_0010e5cd:
  (params->dist).distance_postfix_bits = uVar32;
LAB_0010e5e4:
  (params->dist).max_distance = uVar25 + 4;
LAB_0010e5f6:
  if (0x7e4 < local_e8) {
    local_38 = local_100 + 4;
    uVar31 = local_50 - uVar25;
    local_ac = 0;
LAB_0010e626:
    local_80 = uVar31 >> 3;
    uVar26 = uVar26 - 1;
    uVar33 = local_128 - 1;
    if (uVar26 <= local_128 - 1) {
      uVar33 = uVar26;
    }
    if (4 < *(int *)(literal_context_lut + 4)) {
      uVar33 = 0;
    }
    uVar29 = uVar25 + 1;
    uVar10 = uVar16;
    if (uVar29 < uVar16) {
      uVar10 = uVar29;
    }
    puVar1 = ringbuffer + (uVar29 & ringbuffer_mask);
    uVar23 = puVar1[uVar33];
    local_130 = (ulong)*(int *)&(hasher->common).extra;
    local_108 = 0x7e4;
    if ((uVar29 - local_130 < uVar29) &&
       (uVar8 = (uint)(uVar29 - local_130) & (uint)local_60, uVar23 == ringbuffer[uVar33 + uVar8]))
    {
      if (7 < uVar26) {
        lVar20 = 0;
        uVar17 = 0;
LAB_0010e6c4:
        if (*(ulong *)(puVar1 + uVar17 * 8) == *(ulong *)(ringbuffer + uVar17 * 8 + (ulong)uVar8))
        goto code_r0x0010e6d2;
        uVar22 = *(ulong *)(ringbuffer + uVar17 * 8 + (ulong)uVar8) ^
                 *(ulong *)(puVar1 + uVar17 * 8);
        uVar17 = 0;
        if (uVar22 != 0) {
          for (; (uVar22 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
          }
        }
        local_138 = (uVar17 >> 3 & 0x1fffffff) - lVar20;
        goto LAB_0010e6fe;
      }
      local_138 = 0;
      puVar30 = puVar1;
      goto LAB_0010eacf;
    }
    goto LAB_0010e72f;
  }
  local_100 = local_100 + 1;
  position = uVar25 + 1;
  if ((num_literals == (size_t *)0x0) && (local_88 < position)) {
    if (local_58 + local_88 < position) {
      uVar33 = uVar25 + 0x11;
      if (local_70 <= uVar25 + 0x11) {
        uVar33 = local_70;
      }
      for (; position < uVar33; position = position + 4) {
        *(uint *)(lVar4 + (ulong)((uint)(ushort)((ulong)(*(long *)(ringbuffer +
                                                                  (position & ringbuffer_mask)) *
                                                        -0x42e1ca5843000000) >> 0x30) +
                                  ((uint)position & 8) & 0xffff) * 4) = (uint)position;
        local_100 = local_100 + 4;
      }
    }
    else {
      uVar33 = uVar25 + 9;
      if (local_70 <= uVar25 + 9) {
        uVar33 = local_70;
      }
      for (; position < uVar33; position = position + 2) {
        *(uint *)(lVar4 + (ulong)((uint)(ushort)((ulong)(*(long *)(ringbuffer +
                                                                  (position & ringbuffer_mask)) *
                                                        -0x42e1ca5843000000) >> 0x30) +
                                  ((uint)position & 8) & 0xffff) * 4) = (uint)position;
        local_100 = local_100 + 2;
      }
    }
  }
  goto LAB_0010ef10;
code_r0x0010e6d2:
  uVar17 = uVar17 + 1;
  lVar20 = lVar20 + -8;
  if (local_80 == uVar17) goto code_r0x0010e6e0;
  goto LAB_0010e6c4;
code_r0x0010e6e0:
  local_138 = -lVar20;
  puVar30 = puVar1 + -lVar20;
LAB_0010eacf:
  uVar17 = uVar26 & 7;
  for (; (uVar17 != 0 && (ringbuffer[local_138 + uVar8] == *puVar30)); local_138 = local_138 + 1) {
    puVar30 = puVar30 + 1;
    uVar17 = uVar17 - 1;
  }
LAB_0010e6fe:
  if ((local_138 < 4) || (uVar17 = local_138 * 0x87 + 0x78f, uVar17 < 0x7e5)) {
LAB_0010e72f:
    local_130 = 0;
    local_138 = 0;
  }
  else {
    uVar23 = puVar1[local_138];
    uVar33 = local_138;
    local_108 = uVar17;
  }
  local_a8[0] = (ulong)(*(long *)(ringbuffer + (uVar29 & ringbuffer_mask)) * -0x42e1ca5843000000) >>
                0x30;
  local_a8[1] = (ulong)((ushort)((ulong)(*(long *)(ringbuffer + (uVar29 & ringbuffer_mask)) *
                                        -0x42e1ca5843000000) >> 0x30) + 8 & 0xffff);
  uVar8 = (uint)uVar29;
  local_88 = *(long *)((long)local_a8 + (ulong)(uVar8 & 8));
  local_78 = (ulong)((uint)uVar26 & 7);
  puVar11 = local_a8;
  bVar15 = true;
LAB_0010e78f:
  uVar9 = *(uint *)(lVar4 + *puVar11 * 4);
  uVar7 = (uint)local_60 & uVar9;
  if (((uVar23 == ringbuffer[uVar33 + uVar7]) && (uVar29 != uVar9)) &&
     (uVar17 = uVar29 - uVar9, uVar17 <= uVar10)) {
    uVar22 = local_78;
    if (7 < uVar26) {
      lVar20 = 0;
      uVar28 = 0;
LAB_0010e7d4:
      if (*(ulong *)(puVar1 + uVar28 * 8) == *(ulong *)(ringbuffer + uVar28 * 8 + (ulong)uVar7))
      goto code_r0x0010e7e2;
      uVar28 = *(ulong *)(ringbuffer + uVar28 * 8 + (ulong)uVar7) ^ *(ulong *)(puVar1 + uVar28 * 8);
      uVar22 = 0;
      if (uVar28 != 0) {
        for (; (uVar28 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
        }
      }
      uVar28 = (uVar22 >> 3 & 0x1fffffff) - lVar20;
      goto LAB_0010e80b;
    }
    uVar28 = 0;
    puVar30 = puVar1;
    goto joined_r0x0010e87f;
  }
  goto LAB_0010e85d;
code_r0x0010e7e2:
  uVar28 = uVar28 + 1;
  lVar20 = lVar20 + -8;
  if (local_80 == uVar28) goto code_r0x0010e7f0;
  goto LAB_0010e7d4;
code_r0x0010e7f0:
  uVar28 = -lVar20;
  puVar30 = puVar1 + -lVar20;
joined_r0x0010e87f:
  for (; (uVar22 != 0 && (ringbuffer[uVar28 + uVar7] == *puVar30)); uVar28 = uVar28 + 1) {
    uVar22 = uVar22 - 1;
    puVar30 = puVar30 + 1;
  }
LAB_0010e80b:
  if (3 < uVar28) {
    iVar13 = 0x1f;
    if ((uint)uVar17 != 0) {
      for (; (uint)uVar17 >> iVar13 == 0; iVar13 = iVar13 + -1) {
      }
    }
    uVar22 = (ulong)(iVar13 * -0x1e + 0x780) + uVar28 * 0x87;
    if (local_108 < uVar22) {
      uVar23 = puVar1[uVar28];
      uVar33 = uVar28;
      local_138 = uVar28;
      local_130 = uVar17;
      local_108 = uVar22;
    }
  }
LAB_0010e85d:
  puVar11 = local_a8 + 1;
  bVar14 = !bVar15;
  bVar15 = false;
  if (bVar14) goto LAB_0010e899;
  goto LAB_0010e78f;
LAB_0010e899:
  *(uint *)(lVar4 + local_88 * 4) = uVar8;
  if (uVar26 < 0x20 || (uVar29 & 3) != 0) goto LAB_0010ea5b;
  uVar33 = (params->dist).max_distance;
  if (uVar33 <= uVar29) {
    uVar32 = (params->dist).distance_postfix_bits;
    iVar13 = *(int *)((long)&(params->dictionary).words + 4);
    uVar3 = (params->dictionary).num_transforms;
LAB_0010e8fa:
    uVar9 = uVar32 & 0x3fffffff;
    bVar6 = ringbuffer[uVar33 & ringbuffer_mask];
    bVar2 = ringbuffer[uVar33 + 0x20 & ringbuffer_mask];
    if (uVar9 < 0x1000000) {
      lVar20 = *(long *)&(params->dist).alphabet_size_max;
      uVar7 = *(uint *)(lVar20 + (ulong)uVar9 * 4);
      *(int *)(lVar20 + (ulong)uVar9 * 4) = (int)uVar33;
      if ((uVar33 == uVar29) && (uVar7 != 0xffffffff)) {
        uVar9 = uVar8 - uVar7;
        if (uVar9 <= uVar10) {
          lVar20 = 0;
          uVar17 = 0;
LAB_0010e97d:
          if (*(ulong *)(puVar1 + uVar17 * 8) ==
              *(ulong *)(ringbuffer + uVar17 * 8 + (ulong)(uVar7 & (uint)local_60)))
          goto code_r0x0010e98c;
          uVar22 = *(ulong *)(ringbuffer + uVar17 * 8 + (ulong)(uVar7 & (uint)local_60)) ^
                   *(ulong *)(puVar1 + uVar17 * 8);
          uVar17 = 0;
          if (uVar22 != 0) {
            for (; (uVar22 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
            }
          }
          uVar17 = (uVar17 >> 3 & 0x1fffffff) - lVar20;
          goto LAB_0010e9d9;
        }
      }
    }
    goto LAB_0010e94d;
  }
  goto LAB_0010ea45;
code_r0x0010e98c:
  uVar17 = uVar17 + 1;
  lVar20 = lVar20 + -8;
  if (local_80 == uVar17) goto code_r0x0010e99a;
  goto LAB_0010e97d;
code_r0x0010e99a:
  uVar22 = local_78;
  for (uVar17 = -lVar20;
      (uVar22 != 0 && (ringbuffer[uVar17 + (uVar7 & (uint)local_60)] == puVar1[uVar17]));
      uVar17 = uVar17 + 1) {
    uVar22 = uVar22 - 1;
  }
LAB_0010e9d9:
  if ((3 < uVar17) && (local_138 < uVar17)) {
    iVar12 = 0x1f;
    if (uVar9 != 0) {
      for (; uVar9 >> iVar12 == 0; iVar12 = iVar12 + -1) {
      }
    }
    uVar22 = (ulong)(iVar12 * -0x1e + 0x780) + uVar17 * 0x87;
    if (local_108 < uVar22) {
      local_138 = uVar17;
      local_130 = (ulong)uVar9;
      local_108 = uVar22;
    }
  }
LAB_0010e94d:
  uVar32 = ~(uint)bVar6 * uVar3 + (uint)bVar2 + uVar32 * iVar13 + 1;
  uVar33 = uVar33 + 4;
  if (uVar29 < uVar33) goto LAB_0010ea28;
  goto LAB_0010e8fa;
LAB_0010ea28:
  (params->dist).distance_postfix_bits = uVar32;
LAB_0010ea45:
  (params->dist).max_distance = uVar25 + 5;
LAB_0010ea5b:
  uVar33 = uVar25;
  uVar10 = local_100;
  if ((local_108 < local_e8 + 0xaf) ||
     (local_f0 = local_130, uVar33 = uVar29, local_128 = local_138, uVar10 = local_38, local_ac == 3
     )) goto LAB_0010eb98;
  local_100 = local_100 + 1;
  local_ac = local_ac + 1;
  uVar17 = uVar25 + 9;
  uVar31 = uVar31 - 1;
  local_e8 = local_108;
  uVar25 = uVar29;
  uVar10 = local_100;
  if (local_a8[3] <= uVar17) goto LAB_0010eb98;
  goto LAB_0010e626;
LAB_0010eb98:
  local_100 = uVar10;
  uVar31 = uVar33 + local_48;
  if (uVar16 <= uVar31) {
    uVar31 = uVar16;
  }
  iVar13 = (int)local_100;
  iVar12 = (int)local_128;
  if (uVar31 < local_f0) {
LAB_0010ebc8:
    uVar26 = local_f0 + 0xf;
LAB_0010ebcc:
    if ((local_f0 <= uVar31) && (uVar26 != 0)) {
      *(int *)((long)&(hasher->common).dict_num_lookups + 4) =
           (int)(hasher->common).dict_num_lookups;
      *(void **)((long)&(hasher->common).extra + 4) = (hasher->common).extra;
      *(int *)&(hasher->common).extra = (int)local_f0;
    }
    *(int *)local_e0 = iVar13;
    *(int *)((long)local_e0 + 4) = iVar12;
    uVar31 = (ulong)*(uint *)(literal_context_lut + 0x44) + 0x10;
    iVar24 = 0;
    if (uVar31 <= uVar26) {
      bVar6 = (byte)*(uint *)(literal_context_lut + 0x40);
      uVar25 = ((uVar26 - *(uint *)(literal_context_lut + 0x44)) + (4L << (bVar6 & 0x3f))) - 0x10;
      uVar8 = 0x1f;
      uVar9 = (uint)uVar25;
      if (uVar9 != 0) {
        for (; uVar9 >> uVar8 == 0; uVar8 = uVar8 - 1) {
        }
      }
      uVar8 = (uVar8 ^ 0xffffffe0) + 0x1f;
      uVar29 = (ulong)((uVar25 >> ((ulong)uVar8 & 0x3f) & 1) != 0);
      lVar20 = (ulong)uVar8 - (ulong)*(uint *)(literal_context_lut + 0x40);
      uVar26 = (~(-1 << (bVar6 & 0x1f)) & uVar9) + uVar31 +
               (uVar29 + lVar20 * 2 + 0xfffe << (bVar6 & 0x3f)) | lVar20 * 0x400;
      iVar24 = (int)(uVar25 - (uVar29 + 2 << ((byte)uVar8 & 0x3f)) >> (bVar6 & 0x3f));
    }
  }
  else {
    uVar25 = (ulong)*(int *)&(hasher->common).extra;
    if (local_f0 != uVar25) {
      uVar29 = (ulong)*(int *)((long)&(hasher->common).extra + 4);
      uVar26 = 1;
      if (local_f0 != uVar29) {
        uVar25 = (local_f0 + 3) - uVar25;
        if (uVar25 < 7) {
          bVar6 = (byte)((int)uVar25 << 2);
          uVar8 = 0x9750468;
        }
        else {
          uVar29 = (local_f0 + 3) - uVar29;
          if (6 < uVar29) {
            uVar26 = 2;
            if ((local_f0 != (long)(int)(hasher->common).dict_num_lookups) &&
               (uVar26 = 3, local_f0 != (long)*(int *)((long)&(hasher->common).dict_num_lookups + 4)
               )) goto LAB_0010ebc8;
            goto LAB_0010ebcc;
          }
          bVar6 = (byte)((int)uVar29 << 2);
          uVar8 = 0xfdb1ace;
        }
        uVar26 = (ulong)(uVar8 >> (bVar6 & 0x1f) & 0xf);
      }
      goto LAB_0010ebcc;
    }
    *(int *)local_e0 = iVar13;
    *(int *)((long)local_e0 + 4) = iVar12;
    uVar26 = 0;
    iVar24 = 0;
  }
  *(short *)((long)local_e0 + 0xe) = (short)uVar26;
  *(int *)(local_e0 + 1) = iVar24;
  if (local_100 < 6) {
    uVar31 = local_100 & 0xffffffff;
  }
  else if (local_100 < 0x82) {
    uVar8 = 0x1f;
    uVar9 = (uint)(local_100 - 2);
    if (uVar9 != 0) {
      for (; uVar9 >> uVar8 == 0; uVar8 = uVar8 - 1) {
      }
    }
    uVar31 = (ulong)((int)(local_100 - 2 >> ((char)(uVar8 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                     (uVar8 ^ 0xffffffe0) * 2 + 0x40);
  }
  else if (local_100 < 0x842) {
    uVar8 = 0x1f;
    if (iVar13 - 0x42U != 0) {
      for (; iVar13 - 0x42U >> uVar8 == 0; uVar8 = uVar8 - 1) {
      }
    }
    uVar31 = (ulong)((uVar8 ^ 0xffe0) + 0x2a);
  }
  else {
    uVar31 = 0x15;
    if (0x1841 < local_100) {
      uVar31 = (ulong)(ushort)(0x17 - (local_100 < 0x5842));
    }
  }
  uVar25 = (ulong)iVar12;
  if (uVar25 < 10) {
    uVar8 = iVar12 - 2;
  }
  else if (uVar25 < 0x86) {
    uVar8 = 0x1f;
    uVar9 = (uint)(uVar25 - 6);
    if (uVar9 != 0) {
      for (; uVar9 >> uVar8 == 0; uVar8 = uVar8 - 1) {
      }
    }
    uVar8 = (int)(uVar25 - 6 >> ((char)(uVar8 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
            (uVar8 ^ 0xffffffe0) * 2 + 0x42;
  }
  else {
    uVar8 = 0x17;
    if (uVar25 < 0x846) {
      uVar8 = 0x1f;
      if (iVar12 - 0x46U != 0) {
        for (; iVar12 - 0x46U >> uVar8 == 0; uVar8 = uVar8 - 1) {
        }
      }
      uVar8 = (uVar8 ^ 0xffe0) + 0x2c;
    }
  }
  uVar5 = (ushort)uVar8;
  uVar19 = (uVar5 & 7) + ((ushort)uVar31 & 7) * 8;
  if ((((uVar26 & 0x3ff) == 0) && ((ushort)uVar31 < 8)) && (uVar5 < 0x10)) {
    if (7 < uVar5) {
      uVar19 = uVar19 | 0x40;
    }
  }
  else {
    iVar13 = (int)((uVar31 & 0xffff) >> 3) * 3 + ((uVar8 & 0xffff) >> 3);
    uVar19 = uVar19 + ((ushort)(0x520d40 >> ((char)iVar13 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar13 * 0x40 + 0x40;
  }
  *(ushort *)((long)local_e0 + 0xc) = uVar19;
  *num_commands = *num_commands + local_100;
  position = local_128 + uVar33;
  uVar31 = local_40;
  if (position < local_40) {
    uVar31 = position;
  }
  uVar25 = uVar33 + 2;
  if (local_f0 < local_128 >> 2) {
    uVar26 = position + local_f0 * -4;
    if (uVar26 < uVar25) {
      uVar26 = uVar25;
    }
    uVar25 = uVar26;
    if (uVar31 < uVar26) {
      uVar25 = uVar31;
    }
  }
  local_88 = uVar33 + local_68 + local_128 * 2;
  local_e0 = local_e0 + 2;
  if (uVar25 < uVar31) {
    do {
      *(uint *)(lVar4 + (ulong)((uint)(ushort)((ulong)(*(long *)(ringbuffer +
                                                                (uVar25 & ringbuffer_mask)) *
                                                      -0x42e1ca5843000000) >> 0x30) +
                                ((uint)uVar25 & 8) & 0xffff) * 4) = (uint)uVar25;
      uVar25 = uVar25 + 1;
    } while (uVar31 != uVar25);
    local_100 = 0;
    uVar31 = local_a8[3];
  }
  else {
    local_100 = 0;
    uVar31 = local_a8[3];
  }
LAB_0010ef10:
  uVar25 = position;
  if (uVar31 <= position + 8) goto LAB_0010efe0;
  goto LAB_0010e169;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals,
    const BackwardReferenceFromDecoder* backward_references,
    size_t* back_refs_position, size_t back_refs_size) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  BROTLI_UNUSED(literal_context_lut);

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    sr.used_stored = BROTLI_FALSE;
    FN(FindLongestMatch)(privat, &params->dictionary,
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance,
        backward_references, back_refs_position, back_refs_size, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      /* If a reference from backward_references array was found
         then just take it */
      if (!sr.used_stored) {
          for (;; --max_length) {
            const score_t cost_diff_lazy = 175;
            HasherSearchResult sr2;
            sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
                BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
            sr2.len_code_delta = 0;
            sr2.distance = 0;
            sr2.score = kMinScore;
            sr2.used_stored = BROTLI_FALSE;
            max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
            dictionary_start = BROTLI_MIN(size_t,
                position + 1 + position_offset, max_backward_limit);
            FN(FindLongestMatch)(privat,
                &params->dictionary,
                ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
                max_distance, dictionary_start + gap, params->dist.max_distance,
                backward_references, back_refs_position, back_refs_size, &sr2);
            if (sr2.score >= sr.score + cost_diff_lazy || sr2.used_stored) {
              /* Ok, let's just write one byte for now and start a match from the
                 next byte. */
              ++position;
              ++insert_length;
              sr = sr2;
              /* If a reference from backward_references array was found
                 then just take it */
              if (sr2.used_stored) {
                ++delayed_backward_references_in_row;
                break;
              }
              if (++delayed_backward_references_in_row < 4 &&
                  position + FN(HashTypeLength)() < pos_end) {
                continue;
              }
            }
            break;
          }
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics && back_refs_size == 0) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}